

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O1

unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_> __thiscall
verilogAST::AssignInliner::process_assign<verilogAST::BlockingAssign>
          (AssignInliner *this,
          unique_ptr<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
          *node)

{
  _func_int *p_Var1;
  _Alloc_hider _Var2;
  _func_int **pp_Var3;
  AssignInliner *in_RDX;
  bool remove;
  string key;
  bool local_69;
  _func_int *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  anon_class_24_3_01e97c98 local_40;
  
  pp_Var3 = (in_RDX->super_Transformer)._vptr_Transformer;
  local_68 = pp_Var3[4];
  pp_Var3[4] = (_func_int *)0x0;
  (**(code **)(node->_M_t).
              super___uniq_ptr_impl<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::BlockingAssign_*,_std::default_delete<verilogAST::BlockingAssign>_>
              .super__Head_base<0UL,_verilogAST::BlockingAssign_*,_false>._M_head_impl)(&local_60);
  _Var2._M_p = local_60._M_dataplus._M_p;
  pp_Var3 = (in_RDX->super_Transformer)._vptr_Transformer;
  local_60._M_dataplus._M_p = (pointer)0x0;
  p_Var1 = pp_Var3[4];
  pp_Var3[4] = (_func_int *)_Var2._M_p;
  if (p_Var1 != (_func_int *)0x0) {
    (**(code **)(*(long *)p_Var1 + 0x10))();
  }
  if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_60._M_dataplus._M_p + 0x10))();
  }
  local_60._M_dataplus._M_p = (pointer)0x0;
  if (local_68 != (_func_int *)0x0) {
    (**(code **)(*(long *)local_68 + 0x10))();
  }
  local_68 = (_func_int *)0x0;
  pp_Var3 = (in_RDX->super_Transformer)._vptr_Transformer;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/assign_inliner.cpp:217:18)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>_&>
    ::_S_vtable._M_arr[*(byte *)(pp_Var3 + 3)]._M_data)
            (&local_60,(anon_class_1_0_00000001 *)&local_40,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>
              *)(pp_Var3 + 2));
  local_40.remove = &local_69;
  local_69 = false;
  pp_Var3 = (in_RDX->super_Transformer)._vptr_Transformer;
  local_40.this = (AssignInliner *)node;
  local_40.key = &local_60;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/assign_inliner.cpp:221:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>_&>
    ::_S_vtable._M_arr[*(byte *)(pp_Var3 + 3)]._M_data)
            (&local_40,
             (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>
              *)(pp_Var3 + 2));
  if (local_69 == false) {
    pp_Var3 = (in_RDX->super_Transformer)._vptr_Transformer;
  }
  else {
    pp_Var3 = (_func_int **)0x0;
    in_RDX = this;
  }
  (this->super_Transformer)._vptr_Transformer = pp_Var3;
  (in_RDX->super_Transformer)._vptr_Transformer = (_func_int **)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
          )(__uniq_ptr_data<verilogAST::BlockingAssign,_std::default_delete<verilogAST::BlockingAssign>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> AssignInliner::process_assign(std::unique_ptr<T> node) {
  node->value = this->visit(std::move(node->value));
  std::string key =
      std::visit([](auto&& value) -> std::string { return value->toString(); },
                 node->target);
  bool remove = false;
  std::visit(
      [&](auto&& value) {
        if (auto ptr = dynamic_cast<Identifier*>(value.get())) {
          if (this->can_inline(key) && this->non_input_ports.count(key) == 0) {
            remove = true;
          } else if (this->inlined_outputs.count(ptr->toString())) {
            remove = true;
          };
        }
      },
      node->target);
  if (remove) {
    return std::unique_ptr<T>{};
  }
  return node;
}